

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argParserBase.h
# Opt level: O0

void __thiscall AutoArgParse::ParseToken::~ParseToken(ParseToken *this)

{
  ParseToken *this_local;
  
  ~ParseToken(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

virtual ~ParseToken() = default;